

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O2

void __thiscall hashset<teaminfo>::clear(hashset<teaminfo> *this)

{
  ulong uVar1;
  ulong uVar2;
  
  if (this->numelems != 0) {
    uVar2 = 0;
    uVar1 = (ulong)(uint)this->size;
    if (this->size < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      this->chains[uVar2] = (chain *)0x0;
    }
    this->numelems = 0;
    this->unused = (chain *)0x0;
    deletechunks(this);
    return;
  }
  return;
}

Assistant:

void clear()
    {
        if(!numelems) return;
        loopi(size) chains[i] = NULL;
        numelems = 0;
        unused = NULL;
        deletechunks();
    }